

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O0

void __thiscall cppnet::BaseLogger::SetLevel(BaseLogger *this,LogLevel level)

{
  bool bVar1;
  element_type *peVar2;
  Log *local_40;
  size_t i_1;
  void *del;
  Log *log;
  size_t size;
  ushort local_16;
  LogLevel local_14;
  uint16_t i;
  BaseLogger *pBStack_10;
  LogLevel level_local;
  BaseLogger *this_local;
  
  this->_level = (uint16_t)level;
  local_14 = level;
  pBStack_10 = this;
  if ((this->_level == 0) ||
     (bVar1 = ThreadSafeQueue<cppnet::Log_*>::Empty(&this->_cache_queue), !bVar1)) {
    if (this->_level == 0) {
      log = (Log *)ThreadSafeQueue<cppnet::Log_*>::Size(&this->_cache_queue);
      del = (void *)0x0;
      i_1 = 0;
      for (local_40 = (Log *)0x0; local_40 < log; local_40 = (Log *)((long)&local_40->_log + 1)) {
        bVar1 = ThreadSafeQueue<cppnet::Log_*>::Pop(&this->_cache_queue,(Log **)&del);
        if (bVar1) {
          i_1 = (size_t)del;
          peVar2 = std::
                   __shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->_allocter);
          (*peVar2->_vptr_Alloter[5])(peVar2,&i_1,0);
        }
      }
    }
  }
  else {
    for (local_16 = 0; local_16 < this->_cache_size; local_16 = local_16 + 1) {
      size = (size_t)NewLog(this);
      ThreadSafeQueue<cppnet::Log_*>::Push(&this->_cache_queue,(Log **)&size);
    }
  }
  return;
}

Assistant:

void BaseLogger::SetLevel(LogLevel level) { 
    _level = level; 
    if (_level > LL_NULL && _cache_queue.Empty()) {
        for (uint16_t i = 0; i < _cache_size; i++) {
            _cache_queue.Push(NewLog());
        }

    } else if (_level == LL_NULL) {
        size_t size = _cache_queue.Size();
        Log* log = nullptr;
        void* del = nullptr;
        for (size_t i = 0; i < size; i++) {
            if (_cache_queue.Pop(log)) {
                del = (void*)log;
                _allocter->Free(del);
            }
        }
    }
}